

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

double_t getMiddlePixelTex(GLfloat *a,GLfloat *b,double n)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double ratio;
  double bNew;
  double aNew;
  double n_local;
  GLfloat *b_local;
  GLfloat *a_local;
  
  dVar3 = round((double)*a * n);
  dVar3 = (dVar3 + 0.5) / n;
  dVar4 = round((double)*b * n);
  dVar4 = (dVar4 - 0.5) / n;
  fVar1 = *b;
  fVar2 = *a;
  *a = (float)dVar3;
  *b = (float)dVar4;
  return (dVar4 - dVar3) / (double)(fVar1 - fVar2);
}

Assistant:

static double_t getMiddlePixelTex(GLfloat* a, GLfloat* b, double n)
{
	double aNew = (round((*a) * n) + 0.5) / n;
	double bNew = (round((*b) * n) - 0.5) / n;
	double ratio = (bNew - aNew) / (*b - *a);
	*a = (GLfloat) aNew;
	*b = (GLfloat) bNew;
	return ratio;
}